

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.h
# Opt level: O2

bool __thiscall
covenant::Solver<covenant::Sym>::refine
          (Solver<covenant::Sym> *this,witness_t *witness,GeneralizationMethod gen,
          bool REFINE_ONLY_FIRST)

{
  pointer pCVar1;
  pointer pCVar2;
  bool bVar3;
  size_type sVar4;
  ostream *poVar5;
  ulong uVar6;
  reference_type pDVar7;
  string *this_00;
  undefined7 in_register_00000009;
  TermFactory *tfac;
  size_t __n;
  uint *arg;
  void *__buf;
  bool bVar8;
  reference rVar9;
  allocator local_385;
  uint local_384;
  long *local_380;
  witness_impl *local_378;
  undefined4 local_36c;
  TermFactory local_368;
  ostream *local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  TermFactory local_330;
  undefined1 local_320 [16];
  string local_310;
  string local_2f0 [32];
  witness_t tmp;
  dfa_t Cex;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  dfa_t gen_lang;
  DFA<covenant::Sym> local_a0;
  
  tfac = (TermFactory *)CONCAT71(in_register_00000009,REFINE_ONLY_FIRST);
  local_36c = SUB84(tfac,0);
  local_378 = (witness_impl *)witness;
  if (avy::AvyLogFlag == '\x01') {
    std::__cxx11::string::string((string *)&Cex,"solver",(allocator *)&tmp);
    sVar4 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)avy::AvyLog_abi_cxx11_,(key_type *)&Cex);
    std::__cxx11::string::~string((string *)&Cex);
    if (sVar4 != 0) {
      std::operator<<((ostream *)&std::cout,"Solution found: ");
      local_320._0_8_ = (this->tfac).px;
      local_320._8_8_ = (this->tfac).pn.pi_;
      if ((sp_counted_base *)local_320._8_8_ != (sp_counted_base *)0x0) {
        LOCK();
        ((sp_counted_base *)local_320._8_8_)->use_count_ =
             ((sp_counted_base *)local_320._8_8_)->use_count_ + 1;
        UNLOCK();
      }
      witness_impl::to_string_abi_cxx11_((string *)&Cex,local_378,(witness_t *)local_320,tfac);
      poVar5 = std::operator<<((ostream *)&std::cout,(string *)&Cex);
      std::operator<<(poVar5,"\n");
      std::__cxx11::string::~string((string *)&Cex);
      boost::detail::shared_count::~shared_count((shared_count *)(local_320 + 8));
    }
  }
  if ((this->opts).is_dot_enabled == true) {
    std::vector<int,_std::allocator<int>_>::vector
              (&tmp,(vector<int,_std::allocator<int>_> *)local_378);
    local_330.px = (this->tfac).px;
    local_330.pn.pi_ = (this->tfac).pn.pi_;
    if (local_330.pn.pi_ != (sp_counted_base *)0x0) {
      LOCK();
      (local_330.pn.pi_)->use_count_ = (local_330.pn.pi_)->use_count_ + 1;
      UNLOCK();
    }
    witness_impl::to_automata<covenant::Sym>(&Cex,&tmp,&local_330);
    boost::detail::shared_count::~shared_count(&local_330.pn);
    std::__cxx11::string::string((string *)(local_320 + 0x10),"Cex ",(allocator *)&gen_lang);
    DFA<covenant::Sym>::print_dot(&Cex,(ostream *)&this->refine_log,(string *)(local_320 + 0x10));
    std::__cxx11::string::~string((string *)(local_320 + 0x10));
    DFA<covenant::Sym>::~DFA(&Cex);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&tmp.super__Vector_base<int,_std::allocator<int>_>);
  }
  if (gen == MAX_GEN) {
    local_380 = (long *)operator_new(0x10);
    *local_380 = (long)&PTR__EpsRefine_001bd048;
    local_380[1] = *(long *)&this->alphstart;
  }
  else {
    local_380 = (long *)operator_new(8);
    *local_380 = (long)&PTR__EpsRefine_001bd098;
  }
  local_358 = (ostream *)&this->refine_log;
  local_384 = 0;
  bVar8 = false;
  do {
    if ((ulong)(((long)(this->digests).
                       super__Vector_base<covenant::CFGDigest<covenant::Sym>,_std::allocator<covenant::CFGDigest<covenant::Sym>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->digests).
                      super__Vector_base<covenant::CFGDigest<covenant::Sym>,_std::allocator<covenant::CFGDigest<covenant::Sym>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x98) <= (ulong)local_384) {
LAB_0015b8c7:
      (**(code **)(*local_380 + 8))();
      if (avy::AvyLogFlag != '\0') {
        std::__cxx11::string::string((string *)&Cex,"solver",(allocator *)&tmp);
        sVar4 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)avy::AvyLog_abi_cxx11_,(key_type *)&Cex);
        std::__cxx11::string::~string((string *)&Cex);
        if (sVar4 != 0) {
          std::operator<<((ostream *)&std::cout,"Refinement done.\n");
          std::operator<<((ostream *)&std::cout,
                          "===================================================\n");
        }
      }
      return bVar8;
    }
    rVar9 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->exact,(ulong)local_384);
    if ((*rVar9._M_p & rVar9._M_mask) == 0) {
      pCVar1 = (this->digests).
               super__Vector_base<covenant::CFGDigest<covenant::Sym>,_std::allocator<covenant::CFGDigest<covenant::Sym>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_368.px = (this->tfac).px;
      local_368.pn.pi_ = (this->tfac).pn.pi_;
      if (local_368.pn.pi_ != (sp_counted_base *)0x0) {
        LOCK();
        (local_368.pn.pi_)->use_count_ = (local_368.pn.pi_)->use_count_ + 1;
        UNLOCK();
      }
      CondEpsGen<covenant::Sym>::CondEpsGen
                ((CondEpsGen<covenant::Sym> *)&Cex,pCVar1 + local_384,
                 (vector<int,_std::allocator<int>_> *)local_378,&local_368);
      boost::detail::shared_count::~shared_count(&local_368.pn);
      bVar3 = CondEpsGen<covenant::Sym>::is_empty((CondEpsGen<covenant::Sym> *)&Cex);
      if (bVar3) {
        (**(code **)(*local_380 + 0x10))(&gen_lang,local_380,(CondEpsGen<covenant::Sym> *)&Cex);
        DFA<covenant::Sym>::eps_elim(&gen_lang);
        if ((this->opts).is_dot_enabled == true) {
          std::__cxx11::string::string((string *)&tmp,"Generalized cex wrt CFG ",&local_385);
          boost::lexical_cast<std::__cxx11::string,unsigned_int>(&local_350,(boost *)&local_384,arg)
          ;
          std::operator+(&local_130,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tmp,
                         &local_350);
          DFA<covenant::Sym>::print_dot(&gen_lang,local_358,&local_130);
          std::__cxx11::string::~string((string *)&local_130);
          std::__cxx11::string::~string((string *)&local_350);
          std::__cxx11::string::~string((string *)&tmp);
        }
        uVar6 = (ulong)local_384;
        pCVar2 = (this->cfgs).super__Vector_base<covenant::CFG,_std::allocator<covenant::CFG>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        DFA<covenant::Sym>::difference
                  ((optional<covenant::DFA<covenant::Sym>_> *)&tmp,
                   (this->reg_langs).
                   super__Vector_base<covenant::DFA<covenant::Sym>,_std::allocator<covenant::DFA<covenant::Sym>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar6,&gen_lang,
                   pCVar2[uVar6].alphstart,pCVar2[uVar6].alphsz);
        if ((char)tmp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start == '\0') {
          this_00 = (string *)__cxa_allocate_exception(0x20);
          std::__cxx11::string::string
                    (local_2f0,"refinement did not make any progress",(allocator *)&local_350);
          std::__cxx11::string::string(this_00,local_2f0);
          __cxa_throw(this_00,&error::typeinfo,error::~error);
        }
        pDVar7 = boost::optional<covenant::DFA<covenant::Sym>_>::get
                           ((optional<covenant::DFA<covenant::Sym>_> *)&tmp);
        __n = (size_t)local_384;
        DFA<covenant::Sym>::operator=
                  ((this->reg_langs).
                   super__Vector_base<covenant::DFA<covenant::Sym>,_std::allocator<covenant::DFA<covenant::Sym>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + __n,pDVar7);
        if (avy::AvyLogFlag == '\x01') {
          std::__cxx11::string::string((string *)&local_350,"solver",&local_385);
          sVar4 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)avy::AvyLog_abi_cxx11_,&local_350);
          std::__cxx11::string::~string((string *)&local_350);
          if (sVar4 != 0) {
            poVar5 = std::operator<<((ostream *)&std::cout,"New refined regular approximation:\n");
            pDVar7 = boost::optional<covenant::DFA<covenant::Sym>_>::get
                               ((optional<covenant::DFA<covenant::Sym>_> *)&tmp);
            DFA<covenant::Sym>::DFA(&local_a0,pDVar7);
            poVar5 = (ostream *)DFA<covenant::Sym>::write(&local_a0,(int)poVar5,__buf,__n);
            std::operator<<(poVar5,"\n");
            DFA<covenant::Sym>::~DFA(&local_a0);
          }
        }
        if (avy::AvyLogFlag == '\x01') {
          std::__cxx11::string::string((string *)&local_350,"verbose",&local_385);
          sVar4 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)avy::AvyLog_abi_cxx11_,&local_350);
          std::__cxx11::string::~string((string *)&local_350);
          if (sVar4 != 0) {
            poVar5 = std::operator<<((ostream *)&std::cout,"Automata ");
            poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
            std::operator<<(poVar5," refined.\n");
          }
        }
        boost::optional_detail::optional_base<covenant::DFA<covenant::Sym>_>::~optional_base
                  ((optional_base<covenant::DFA<covenant::Sym>_> *)&tmp);
        DFA<covenant::Sym>::~DFA(&gen_lang);
        bVar8 = true;
        if ((char)local_36c != '\0') {
          CondEpsGen<covenant::Sym>::~CondEpsGen((CondEpsGen<covenant::Sym> *)&Cex);
          bVar8 = true;
          goto LAB_0015b8c7;
        }
      }
      else if (avy::AvyLogFlag == '\x01') {
        std::__cxx11::string::string((string *)&tmp,"verbose",(allocator *)&gen_lang);
        sVar4 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)avy::AvyLog_abi_cxx11_,(key_type *)&tmp);
        std::__cxx11::string::~string((string *)&tmp);
        if (sVar4 != 0) {
          poVar5 = std::operator<<((ostream *)&std::cout,"Cex is accepted by CFG ");
          poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
          std::operator<<(poVar5,"\n");
        }
      }
      CondEpsGen<covenant::Sym>::~CondEpsGen((CondEpsGen<covenant::Sym> *)&Cex);
    }
    else if (avy::AvyLogFlag == '\x01') {
      std::__cxx11::string::string((string *)&Cex,"verbose",(allocator *)&tmp);
      sVar4 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)avy::AvyLog_abi_cxx11_,(key_type *)&Cex);
      std::__cxx11::string::~string((string *)&Cex);
      if (sVar4 != 0) {
        poVar5 = std::operator<<((ostream *)&std::cout,"Automata ");
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        std::operator<<(poVar5," is exact\n");
      }
    }
    local_384 = local_384 + 1;
  } while( true );
}

Assistant:

bool refine(witness_t& witness, 
              GeneralizationMethod gen, 
              bool REFINE_ONLY_FIRST) 
  {


    LOG("solver", 
        cout << "Solution found: ";
        cout << witness_impl::to_string(witness, tfac) << "\n");
    
    if (opts.is_dot_enabled)
    {
      witness_t tmp(witness);
      dfa_t Cex = witness_impl::to_automata<EdgeSym> (tmp, tfac);
                                                      
      Cex.print_dot(refine_log, "Cex ");
    }

   
    // Choose here the generalization method.
    eps_refine_t* r = NULL;
    if(gen == MAX_GEN)
      r = new max_eps_refine_t(alphstart, alphsz);
    else 
      r = new greedy_eps_refine_t();
    
    bool refined = false;
    for(unsigned int li = 0; li < digests.size(); li++)
    {
      // L_i is regular, so w \in L_i
      if(exact[li]) 
      {
        LOG("verbose" , cout << "Automata " << li << " is exact\n");
        continue;
      }
      
      // First, we check if the witness is in the language.
      cond_eps_gen_t gen(digests[li], witness, tfac);
      if(!gen.is_empty())
      {
        LOG("verbose", cout << "Cex is accepted by CFG " << li << "\n");
        continue;
      }
      
      // Otherwise, we refine it.
      dfa_t gen_lang(r->refine(gen));
      
// #ifndef REFINE_DIFF
//       // Haven't currently extended solvers to handle complemented
//       // languages.
//       gen_lang.eps_elim();
//       dfa_t ref_complement(complement(makeDFA(gen_lang, 
//                                                       cfgs[li].alphstart, 
//                                                       cfgs[li].alphsz)));
      
//       // We can either just add ref_complement to the set of regular
//       // languages, or intersect it with an approximation.
//       reg_langs.push_back(ref_complement);
// #else
      gen_lang.eps_elim();

      if (opts.is_dot_enabled)
      {
        gen_lang.print_dot(refine_log, 
                           string("Generalized cex wrt CFG ") + 
                           boost::lexical_cast<string> (li)) ;
      }

      boost::optional<dfa_t> refined_fa = dfa_t::difference (reg_langs[li], 
                                                             gen_lang, 
                                                             cfgs[li].alphstart, 
                                                             cfgs[li].alphsz);
      
      if (!refined_fa)
      {
        throw error ("refinement did not make any progress");
      }
      
      reg_langs[li] = *refined_fa;
 
      LOG("solver", 
            cout << "New refined regular approximation:\n" << *refined_fa << "\n");
           

//#endif
      refined = true;
      LOG("verbose", cout << "Automata " << li << " refined.\n");
      if(REFINE_ONLY_FIRST)
        break;
    }
    
    delete r;
    
    LOG("solver", 
         cout << "Refinement done.\n";
         cout << "===================================================\n");
    
    return refined;
  }